

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariablesHelper.cxx
# Opt level: O2

shared_ptr<cmDebugger::cmDebuggerVariables> __thiscall
cmDebugger::cmDebuggerVariablesHelper::CreateIfAny
          (cmDebuggerVariablesHelper *this,
          shared_ptr<cmDebugger::cmDebuggerVariablesManager> *variablesManager,string *name,
          bool supportsVariableType,vector<cmFileSet_*,_std::allocator<cmFileSet_*>_> *fileSets)

{
  pointer ppcVar1;
  cmDebuggerVariables *this_00;
  string *extraout_RDX;
  pointer ppcVar2;
  shared_ptr<cmDebugger::cmDebuggerVariables> sVar3;
  cmDebuggerVariablesHelper local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  if ((fileSets->super__Vector_base<cmFileSet_*,_std::allocator<cmFileSet_*>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (fileSets->super__Vector_base<cmFileSet_*,_std::allocator<cmFileSet_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    sVar3 = std::
            make_shared<cmDebugger::cmDebuggerVariables,std::shared_ptr<cmDebugger::cmDebuggerVariablesManager>const&,std::__cxx11::string_const&,bool&>
                      ((shared_ptr<cmDebugger::cmDebuggerVariablesManager> *)this,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       variablesManager,(bool *)name);
    name = (string *)
           sVar3.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    ppcVar1 = (fileSets->super__Vector_base<cmFileSet_*,_std::allocator<cmFileSet_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar2 = (fileSets->super__Vector_base<cmFileSet_*,_std::allocator<cmFileSet_*>_>)._M_impl
                   .super__Vector_impl_data._M_start; ppcVar2 != ppcVar1; ppcVar2 = ppcVar2 + 1) {
      this_00 = *(cmDebuggerVariables **)this;
      CreateIfAny(local_40,variablesManager,&(*ppcVar2)->Name,supportsVariableType,*ppcVar2);
      cmDebuggerVariables::AddSubVariables
                (this_00,(shared_ptr<cmDebugger::cmDebuggerVariables> *)local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      name = extraout_RDX;
    }
  }
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cmDebugger::cmDebuggerVariables>)
         sVar3.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cmDebuggerVariables> cmDebuggerVariablesHelper::CreateIfAny(
  std::shared_ptr<cmDebuggerVariablesManager> const& variablesManager,
  std::string const& name, bool supportsVariableType,
  std::vector<cmFileSet*> const& fileSets)
{
  if (fileSets.empty()) {
    return {};
  }

  auto fileSetsVariables = std::make_shared<cmDebuggerVariables>(
    variablesManager, name, supportsVariableType);

  for (auto const& fileSet : fileSets) {
    fileSetsVariables->AddSubVariables(CreateIfAny(
      variablesManager, fileSet->GetName(), supportsVariableType, fileSet));
  }

  return fileSetsVariables;
}